

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaopen_io(lua_State *L)

{
  lua_State *in_RDI;
  FILE *in_stack_00000008;
  lua_State *in_stack_00000010;
  int in_stack_0000001c;
  lua_State *in_stack_00000020;
  int in_stack_0000002c;
  lua_State *in_stack_00000030;
  
  createmeta((lua_State *)0x10f55e);
  newfenv(L,(lua_CFunction)in_RDI);
  lua_replace(in_stack_00000020,in_stack_0000001c);
  luaL_register(L,(char *)in_RDI,(luaL_Reg *)0x10f593);
  newfenv(L,(lua_CFunction)in_RDI);
  createstdfile(in_stack_00000010,in_stack_00000008,L._4_4_,(char *)in_RDI);
  createstdfile(in_stack_00000010,in_stack_00000008,L._4_4_,(char *)in_RDI);
  createstdfile(in_stack_00000010,in_stack_00000008,L._4_4_,(char *)in_RDI);
  lua_settop(in_RDI,-2);
  lua_getfield(in_stack_00000030,in_stack_0000002c,(char *)in_stack_00000020);
  newfenv(L,(lua_CFunction)in_RDI);
  lua_setfenv(in_stack_00000020,in_stack_0000001c);
  lua_settop(in_RDI,-2);
  return 1;
}

Assistant:

static int luaopen_io(lua_State*L){
createmeta(L);
newfenv(L,io_fclose);
lua_replace(L,(-10001));
luaL_register(L,"io",iolib);
newfenv(L,io_noclose);
createstdfile(L,stdin,1,"stdin");
createstdfile(L,stdout,2,"stdout");
createstdfile(L,stderr,0,"stderr");
lua_pop(L,1);
lua_getfield(L,-1,"popen");
newfenv(L,io_pclose);
lua_setfenv(L,-2);
lua_pop(L,1);
return 1;
}